

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

void __thiscall
Parse::SMTLIB2::readDefineFun
          (SMTLIB2 *this,string *name,LExprList *iArgs,LExpr *oSort,LExpr *body,TermStack *typeArgs,
          bool recursive)

{
  TermList *pTVar1;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar6;
  LExpr *sExpr;
  TermList TVar7;
  DeclaredSymbol DVar8;
  TermList TVar9;
  AtomicFormula *pAVar10;
  Literal *pLVar11;
  FormulaUnit *this_00;
  UserErrorException *pUVar12;
  Symbol *pSVar13;
  TermStack *__range1;
  TermList *ta;
  TermList *pTVar14;
  SymbolType SVar15;
  pair<Kernel::TermList,_Kernel::TermList> val;
  TermStack defArgs;
  TermList rhs;
  LispListReader iaRdr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  LExpr *local_198;
  TermList local_190;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ParseResult res;
  LispListReader pRdr;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = isAlreadyKnownSymbol(this,name);
  if (bVar3) {
    pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_1d8,"Redeclaring function symbol: ",name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defArgs,
                   &local_1d8," in top-level expression \'");
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_1b8,this->_topLevelExpr,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defArgs,
                   &local_1b8);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,"\'");
    Lib::UserErrorException::Exception(pUVar12,&local_70);
    __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  local_190 = parseSort(this,oSort);
  pDVar6 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)Lib::
              DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
              ::operator_new(0x28);
  pDVar6->_timestamp = 1;
  *(undefined4 *)((long)&pDVar6->_afterLast + 4) = 0;
  pDVar6->_size = 0;
  pDVar6->_deleted = 0;
  pDVar6->_capacityIndex = 0;
  pDVar6->_capacity = 0;
  *(undefined8 *)&pDVar6->_nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&pDVar6->_entries + 4) = 0;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::argSorts == '\0') {
    iVar5 = __cxa_guard_acquire(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                                 ::argSorts);
    if (iVar5 != 0) {
      readDefineFun::argSorts._cursor = (TermList *)0x0;
      readDefineFun::argSorts._end = (TermList *)0x0;
      readDefineFun::argSorts._capacity = 0;
      readDefineFun::argSorts._stack = (TermList *)0x0;
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&readDefineFun::argSorts,&__dso_handle);
      __cxa_guard_release(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                           ::argSorts);
    }
  }
  readDefineFun::argSorts._cursor = readDefineFun::argSorts._stack;
  local_198 = oSort;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::args == '\0') {
    iVar5 = __cxa_guard_acquire(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                                 ::args);
    if (iVar5 != 0) {
      readDefineFun::args._cursor = (TermList *)0x0;
      readDefineFun::args._end = (TermList *)0x0;
      readDefineFun::args._capacity = 0;
      readDefineFun::args._stack = (TermList *)0x0;
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&readDefineFun::args,&__dso_handle);
      __cxa_guard_release(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                           ::args);
    }
  }
  readDefineFun::args._cursor = readDefineFun::args._stack;
  pTVar1 = typeArgs->_cursor;
  for (pTVar14 = typeArgs->_stack; pTVar14 != pTVar1; pTVar14 = pTVar14 + 1) {
    Lib::Stack<Kernel::TermList>::push(&readDefineFun::args,(TermList)pTVar14->_content);
  }
  iaRdr.it._lst = (Iterator)(Iterator)iArgs;
  while (iaRdr.it._lst != (List<Shell::LispParser::Expression_*> *)0x0) {
    pRdr.it._lst = (Iterator)Shell::LispListReader::readList(&iaRdr);
    Shell::LispListReader::readAtom_abi_cxx11_((string *)&res,&pRdr);
    sExpr = Shell::LispListReader::readNext(&pRdr);
    TVar7 = parseSort(this,sExpr);
    Shell::LispListReader::acceptEOL(&pRdr);
    uVar4 = this->_nextVar;
    this->_nextVar = uVar4 + 1;
    TVar9._content._4_4_ = 0;
    TVar9._content._0_4_ = uVar4 * 4 + 1;
    Lib::Stack<Kernel::TermList>::push(&readDefineFun::args,TVar9);
    std::__cxx11::string::string((string *)&local_50,(string *)&res);
    val.second._content = TVar7._content;
    val.first._content = TVar9._content;
    bVar3 = Lib::
            DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::insert(pDVar6,&local_50,val);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) {
      pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_168,"Multiple occurrence of variable ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
      std::operator+(&local_148,&local_168," in the definition of function ");
      std::operator+(&local_1b8,&local_148,name);
      std::operator+(&local_1d8,&local_1b8," in top-level expression \'");
      Shell::LispParser::Expression::toString_abi_cxx11_(&local_188,this->_topLevelExpr,true);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defArgs,
                     &local_1d8,&local_188);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defArgs,
                     "\'");
      Lib::UserErrorException::Exception(pUVar12,&local_90);
      __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    Lib::Stack<Kernel::TermList>::push(&readDefineFun::argSorts,TVar7);
    std::__cxx11::string::~string((string *)&res);
  }
  Lib::
  Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
  ::push(&this->_scopes,pDVar6);
  TVar7._content = local_190._content;
  DVar8.first = 0;
  DVar8.second = FUNCTION;
  SVar15 = FUNCTION;
  if (recursive) {
    DVar8 = declareFunctionOrPredicate
                      (this,name,local_190,&readDefineFun::argSorts,
                       (uint)((ulong)((long)typeArgs->_cursor - (long)typeArgs->_stack) >> 3));
    SVar15 = DVar8.second;
  }
  parseTermOrFormula(&res,this,body,false);
  ppDVar2 = (this->_scopes)._cursor;
  (this->_scopes)._cursor = ppDVar2 + -1;
  pDVar6 = ppDVar2[-1];
  if (pDVar6 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                 *)0x0) {
    Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::~DHMap(pDVar6);
  }
  Lib::
  DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
  ::operator_delete(pDVar6,0x28);
  rhs._content = 2;
  TVar9 = ParseResult::asTerm(&res,&rhs);
  if (TVar9._content == TVar7._content) {
    if (!recursive) {
      DVar8 = declareFunctionOrPredicate
                        (this,name,TVar7,&readDefineFun::argSorts,
                         (uint)((ulong)((long)typeArgs->_cursor - (long)typeArgs->_stack) >> 3));
      SVar15 = DVar8.second;
    }
    uVar4 = DVar8.first;
    if (SVar15 == FUNCTION) {
      pSVar13 = (DAT_00a14190->_funs)._stack[(ulong)DVar8 & 0xffffffff];
      TVar7._content =
           (uint64_t)
           Kernel::Term::create
                     (uVar4,(uint)((ulong)((long)readDefineFun::args._cursor -
                                          (long)readDefineFun::args._stack) >> 3),
                      readDefineFun::args._stack);
      uVar4 = Kernel::Signature::getFnDef(DAT_00a14190,uVar4);
      Lib::Stack<Kernel::TermList>::Stack(&defArgs,typeArgs);
      Lib::Stack<Kernel::TermList>::push(&defArgs,TVar7);
      Lib::Stack<Kernel::TermList>::push(&defArgs,rhs);
      pLVar11 = Kernel::Literal::create
                          (uVar4,(uint)((ulong)((long)defArgs._cursor - (long)defArgs._stack) >> 3),
                           true,defArgs._stack);
      Lib::Stack<Kernel::TermList>::~Stack(&defArgs);
    }
    else {
      pSVar13 = (DAT_00a14190->_preds)._stack[(ulong)DVar8 & 0xffffffff];
      uVar4 = Kernel::Signature::getBoolDef(DAT_00a14190,uVar4);
      pAVar10 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
      pLVar11 = Kernel::Literal::create
                          (uVar4,(uint)((ulong)((long)readDefineFun::args._cursor -
                                               (long)readDefineFun::args._stack) >> 3),true,
                           readDefineFun::args._stack);
      Kernel::AtomicFormula::AtomicFormula(pAVar10,pLVar11);
      TVar9._content = (uint64_t)Kernel::Term::createFormula((Formula *)pAVar10);
      pLVar11 = Kernel::Literal::createEquality(true,TVar9,rhs,TVar7);
    }
    pAVar10 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    Kernel::AtomicFormula::AtomicFormula(pAVar10,pLVar11);
    pSVar13->field_0x40 = pSVar13->field_0x40 | 8;
    this_00 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
    local_1d8._M_dataplus._M_p._0_1_ = 1;
    Kernel::Inference::Inference((Inference *)&defArgs,(FromInput *)&local_1d8);
    Kernel::FormulaUnit::FormulaUnit(this_00,(Formula *)pAVar10,(Inference *)&defArgs);
    Lib::List<Kernel::Unit_*>::FIFO::pushBack(&this->_formulas,(Unit *)this_00);
    std::__cxx11::string::~string((string *)&res.label);
    return;
  }
  pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_188,body,true);
  std::operator+(&local_168,"Defined function body ",&local_188);
  std::operator+(&local_148,&local_168," has different sort than declared ");
  Shell::LispParser::Expression::toString_abi_cxx11_((string *)&pRdr,local_198,true);
  std::operator+(&local_1b8,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pRdr);
  std::operator+(&local_1d8,&local_1b8," in top-level expression \'");
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_d0,this->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defArgs,
                 &local_1d8,&local_d0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defArgs,"\'")
  ;
  Lib::UserErrorException::Exception(pUVar12,&local_b0);
  __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::readDefineFun(const std::string& name, LExprList* iArgs, LExpr* oSort, LExpr* body, const TermStack& typeArgs, bool recursive)
{
  if (isAlreadyKnownSymbol(name)) {
    USER_ERROR_EXPR("Redeclaring function symbol: "+name);
  }

  TermList rangeSort = parseSort(oSort);

  TermLookup* lookup = new TermLookup();

  static TermStack argSorts;
  argSorts.reset();

  static TermStack args;
  args.reset();
  for (const auto& ta : typeArgs) {
    args.push(ta);
  }

  LispListReader iaRdr(iArgs);
  while (iaRdr.hasNext()) {
    LExprList* pair = iaRdr.readList();
    LispListReader pRdr(pair);

    std::string vName = pRdr.readAtom();
    TermList vSort = parseSort(pRdr.readNext());

    pRdr.acceptEOL();

    TermList arg = TermList::var(_nextVar++);
    args.push(arg);

    if (!lookup->insert(vName,make_pair(arg,vSort))) {
      USER_ERROR_EXPR("Multiple occurrence of variable "+vName+" in the definition of function "+name);
    }

    argSorts.push(vSort);
  }

  _scopes.push(lookup);

  DeclaredSymbol fun;
  if (recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  delete _scopes.pop();

  TermList rhs;
  if (res.asTerm(rhs) != rangeSort) {
    USER_ERROR_EXPR("Defined function body "+body->toString()+" has different sort than declared "+oSort->toString());
  }

  if (!recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  unsigned symbIdx = fun.first;
  ASS(fun.second != SymbolType::TYPECON);
  bool isTrueFun = fun.second==SymbolType::FUNCTION;

  Literal* lit;
  Signature::Symbol* sym;
  if (isTrueFun) {
    sym = env.signature->getFunction(symbIdx);

    TermList lhs(Term::create(symbIdx,args.size(),args.begin()));
    auto p = env.signature->getFnDef(symbIdx);
    auto defArgs = typeArgs;
    defArgs.push(lhs);
    defArgs.push(rhs);
    lit = Literal::create(p,defArgs.size(),true,defArgs.begin());
  } else {
    sym = env.signature->getPredicate(symbIdx);

    auto p = env.signature->getBoolDef(symbIdx);
    TermList lhs(Term::createFormula(new AtomicFormula(Literal::create(p,args.size(),true,args.begin()))));
    lit = Literal::createEquality(true, lhs, rhs, rangeSort);
  }
  Formula* fla = new AtomicFormula(lit);

  // Mark original symbol protected to avoid
  // erroneous unused symbol elimination later.
  // TODO find a better way to do this
  sym->markProtected();

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));

  _formulas.pushBack(fu);
}